

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exec.cc
# Opt level: O1

void __thiscall cnn::SimpleExecutionEngine::backward(SimpleExecutionEngine *this)

{
  ComputationGraph *pCVar1;
  
  pCVar1 = (this->super_ExecutionEngine).cg;
  if (((long)(this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(this->nfxs).super__Vector_base<cnn::Tensor,_std::allocator<cnn::Tensor>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) * -0x71c71c71c71c71c7 -
      ((long)(pCVar1->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_finish -
       (long)(pCVar1->nodes).super__Vector_base<cnn::Node_*,_std::allocator<cnn::Node_*>_>._M_impl.
             super__Vector_impl_data._M_start >> 3) == 0) {
    (*(this->super_ExecutionEngine)._vptr_ExecutionEngine[9])();
    return;
  }
  __assert_fail("nfxs.size() == cg.nodes.size()",
                "/workspace/llm4binary/github/license_all_cmakelists_25/LeonCrashCode[P]LookAheadFeature/cnn/exec.cc"
                ,0x50,"virtual void cnn::SimpleExecutionEngine::backward()");
}

Assistant:

void SimpleExecutionEngine::backward() {
  assert(nfxs.size() == cg.nodes.size());
  backward((VariableIndex)(cg.nodes.size()-1));
}